

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
valueStart(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  char cVar5;
  byte bVar6;
  byte *pbVar7;
  
  pbVar2 = *(byte **)this;
  bVar6 = *pbVar2;
  if ((bVar6 & 0xfe) == 0xee) {
    bVar3 = 0;
    pbVar7 = pbVar2;
    do {
      pbVar1 = pbVar7 + 9;
      pbVar7 = pbVar7 + 2;
      cVar5 = '\x02';
      if (bVar6 != 0xee) {
        pbVar7 = pbVar1;
        cVar5 = '\t';
      }
      bVar3 = bVar3 + cVar5;
      bVar6 = *pbVar7;
    } while ((bVar6 & 0xfe) == 0xee);
    uVar4 = (ulong)bVar3;
  }
  else {
    uVar4 = 0;
  }
  return pbVar2 + uVar4;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }